

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ab9709::Target::DumpInstallDestinations
          (Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__x;
  reference ppcVar2;
  cmGeneratorTarget *pcVar3;
  cmInstallTargetGenerator *local_c8;
  Value local_98;
  cmInstallTargetGenerator *local_70;
  cmInstallTargetGenerator *itGen;
  cmInstallGenerator *iGen;
  iterator __end1;
  iterator __begin1;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range1;
  undefined1 local_38 [8];
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> installGens;
  Target *this_local;
  Value *destinations;
  
  installGens.super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __x = cmMakefile::GetInstallGenerators(this->GT->Makefile);
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
            ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)local_38,__x);
  __end1 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                     ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                      local_38);
  iGen = (cmInstallGenerator *)
         std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                   ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)local_38)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                                *)&iGen);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
              ::operator*(&__end1);
    itGen = (cmInstallTargetGenerator *)*ppcVar2;
    if (itGen == (cmInstallTargetGenerator *)0x0) {
      local_c8 = (cmInstallTargetGenerator *)0x0;
    }
    else {
      local_c8 = (cmInstallTargetGenerator *)
                 __dynamic_cast(itGen,&cmInstallGenerator::typeinfo,
                                &cmInstallTargetGenerator::typeinfo,0);
    }
    local_70 = local_c8;
    if (local_c8 != (cmInstallTargetGenerator *)0x0) {
      pcVar3 = cmInstallTargetGenerator::GetTarget(local_c8);
      if (pcVar3 == this->GT) {
        DumpInstallDestination(&local_98,this,local_70);
        Json::Value::append(__return_storage_ptr__,&local_98);
        Json::Value::~Value(&local_98);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
    ::operator++(&__end1);
  }
  installGens.super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::~vector
            ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)local_38);
  if ((installGens.super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpInstallDestinations()
{
  Json::Value destinations = Json::arrayValue;
  auto installGens = this->GT->Makefile->GetInstallGenerators();
  for (auto iGen : installGens) {
    auto itGen = dynamic_cast<cmInstallTargetGenerator*>(iGen);
    if (itGen != nullptr && itGen->GetTarget() == this->GT) {
      destinations.append(this->DumpInstallDestination(itGen));
    }
  }
  return destinations;
}